

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void anon_unknown.dwarf_1d643::test_decode_bit_stream_with_no_marker_start(void)

{
  bool condition;
  jpegls_decoder *this;
  error_code local_4c0;
  jpegls_error *e;
  undefined1 local_498 [8];
  jpegls_decoder decoder;
  error_code error;
  array<unsigned_char,_1000UL> output;
  array<unsigned_char,_2UL> encoded_data;
  
  output._M_elems[0x3e0] = '3';
  output._M_elems[0x3e1] = '3';
  memset((void *)((long)&error._M_cat + 6),0,1000);
  std::error_code::error_code((error_code *)&decoder.application_data_handler_._M_invoker);
  charls::jpegls_decoder::jpegls_decoder((jpegls_decoder *)local_498);
  this = charls::jpegls_decoder::source<std::array<unsigned_char,2ul>,unsigned_char>
                   ((jpegls_decoder *)local_498,
                    (array<unsigned_char,_2UL> *)(output._M_elems + 0x3e0));
  charls::jpegls_decoder::read_header(this);
  charls::jpegls_decoder::decode<std::array<unsigned_char,1000ul>,unsigned_char>
            ((jpegls_decoder *)local_498,(array<unsigned_char,_1000UL> *)((long)&error._M_cat + 6),0
            );
  charls::jpegls_decoder::~jpegls_decoder((jpegls_decoder *)local_498);
  std::error_code::error_code<charls::jpegls_errc,void>(&local_4c0,MissingJpegMarkerStart);
  condition = std::operator==((error_code *)&decoder.application_data_handler_._M_invoker,&local_4c0
                             );
  assert::is_true(condition);
  return;
}

Assistant:

void test_decode_bit_stream_with_no_marker_start()
{
    const array<uint8_t, 2> encoded_data{0x33, 0x33};
    array<uint8_t, 1000> output{};

    error_code error;
    try
    {
        jpegls_decoder decoder;
        decoder.source(encoded_data).read_header();
        decoder.decode(output);
    }
    catch (const jpegls_error& e)
    {
        error = e.code();
    }

    assert::is_true(error == jpegls_errc::jpeg_marker_start_byte_not_found);
}